

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool array_array_container_xor(array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  bool bVar1;
  int size;
  array_container_t *paVar2;
  bitset_container_t *pbVar3;
  uint64_t uVar4;
  bitset_container_t *ourbitset;
  _Bool returnval;
  int totalCardinality;
  container_t **dst_local;
  array_container_t *src_2_local;
  array_container_t *src_1_local;
  
  size = src_1->cardinality + src_2->cardinality;
  if (size < 0x1001) {
    paVar2 = array_container_create_given_capacity(size);
    *dst = paVar2;
    array_container_xor(src_1,src_2,(array_container_t *)*dst);
    src_1_local._7_1_ = false;
  }
  else {
    pbVar3 = bitset_container_from_array(src_1);
    *dst = pbVar3;
    pbVar3 = (bitset_container_t *)*dst;
    uVar4 = bitset_flip_list_withcard
                      (pbVar3->words,(long)src_1->cardinality,src_2->array,(long)src_2->cardinality)
    ;
    pbVar3->cardinality = (int32_t)uVar4;
    bVar1 = pbVar3->cardinality < 0x1001;
    if (bVar1) {
      paVar2 = array_container_from_bitset(pbVar3);
      *dst = paVar2;
      bitset_container_free(pbVar3);
    }
    ourbitset._3_1_ = !bVar1;
    src_1_local._7_1_ = ourbitset._3_1_;
  }
  return src_1_local._7_1_;
}

Assistant:

bool array_array_container_xor(
    const array_container_t *src_1, const array_container_t *src_2,
    container_t **dst
){
    int totalCardinality =
        src_1->cardinality + src_2->cardinality;  // upper bound
    if (totalCardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_create_given_capacity(totalCardinality);
        array_container_xor(src_1, src_2, CAST_array(*dst));
        return false;  // not a bitset
    }
    *dst = bitset_container_from_array(src_1);
    bool returnval = true;  // expect a bitset
    bitset_container_t *ourbitset = CAST_bitset(*dst);
    ourbitset->cardinality = (uint32_t)bitset_flip_list_withcard(
        ourbitset->words, src_1->cardinality, src_2->array, src_2->cardinality);
    if (ourbitset->cardinality <= DEFAULT_MAX_SIZE) {
        // need to convert!
        *dst = array_container_from_bitset(ourbitset);
        bitset_container_free(ourbitset);
        returnval = false;  // not going to be a bitset
    }

    return returnval;
}